

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall Search::BaseTask::Run(BaseTask *this)

{
  string *psVar1;
  undefined8 *in_RDI;
  float old_train_loss;
  float old_test_loss;
  bool old_should_produce_string;
  search_private *priv;
  allocator local_41;
  string local_40 [36];
  undefined4 local_1c;
  undefined4 local_18;
  byte local_11;
  long local_10;
  
  local_10 = *(long *)*in_RDI;
  local_11 = *(byte *)(local_10 + 0x271) & 1;
  if (((*(byte *)(in_RDI + 2) & 1) == 0) && (in_RDI[6] == 0)) {
    *(undefined1 *)(local_10 + 0x271) = 0;
  }
  local_18 = *(undefined4 *)(local_10 + 0x244);
  *(float *)(local_10 + 0x248) = *(float *)(local_10 + 0x248) * 0.5;
  local_1c = *(undefined4 *)(local_10 + 0x24c);
  if ((*(byte *)(local_10 + 0x271) & 1) != 0) {
    psVar1 = *(string **)(local_10 + 0x278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
    std::__cxx11::stringstream::str(psVar1);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  *(undefined8 *)(local_10 + 0x98) = 0;
  *(undefined8 **)(local_10 + 0x658) = in_RDI;
  (**(code **)(*(long *)(local_10 + 0x648) + 8))(*in_RDI,in_RDI[1]);
  *(undefined8 *)(local_10 + 0x658) = 0;
  *(long *)(local_10 + 0x660) = *(long *)(local_10 + 0x98) + *(long *)(local_10 + 0x660);
  if ((in_RDI[6] != 0) && ((local_11 & 1) != 0)) {
    (*(code *)in_RDI[6])(*in_RDI,*(undefined8 *)(local_10 + 0x278));
  }
  *(byte *)(local_10 + 0x271) = local_11 & 1;
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    *(undefined4 *)(local_10 + 0x244) = local_18;
    *(undefined4 *)(local_10 + 0x24c) = local_1c;
  }
  return;
}

Assistant:

void BaseTask::Run()
{
  search_private& priv = *sch->priv;
  // make sure output is correct
  bool old_should_produce_string = priv.should_produce_string;
  if (!_final_run && !_with_output_string)
    priv.should_produce_string = false;
  // if this isn't a final run, it shouldn't count for loss
  float old_test_loss = priv.test_loss;
  // float old_learn_loss = priv.learn_loss;
  priv.learn_loss *= 0.5;
  float old_train_loss = priv.train_loss;

  if (priv.should_produce_string)
    priv.pred_string->str("");

  priv.t = 0;
  priv.metaoverride = this;
  priv.task->run(*sch, ec);
  priv.metaoverride = nullptr;
  priv.meta_t += priv.t;

  // restore
  if (_with_output_string && old_should_produce_string)
    _with_output_string(*sch, *priv.pred_string);

  priv.should_produce_string = old_should_produce_string;
  if (!_final_run)
  {
    priv.test_loss = old_test_loss;
    // priv.learn_loss = old_learn_loss;
    priv.train_loss = old_train_loss;
  }
}